

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

longlong NULLC::StrToLong(NULLCArray str)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  
  pcVar4 = str.ptr;
  if (pcVar4 != (char *)0x0) {
    lVar3 = 0;
    for (pcVar1 = pcVar4 + (*pcVar4 == '-'); (int)*pcVar1 - 0x30U < 10; pcVar1 = pcVar1 + 1) {
      lVar3 = (ulong)((int)*pcVar1 - 0x30U) + lVar3 * 10;
    }
    lVar2 = -lVar3;
    if (*pcVar4 != '-') {
      lVar2 = lVar3;
    }
    return lVar2;
  }
  return 0;
}

Assistant:

long long NULLC::StrToLong(NULLCArray str)
{
	if(!str.ptr)
		return 0;

	const char *p = str.ptr;

	bool negative = *p == '-';
	if(negative)
		p++;

	unsigned long long res = 0;
	while(unsigned(*p - '0') < 10)
		res = res * 10 + unsigned(*p++ - '0');

	return res * (negative ? -1 : 1);
}